

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.h
# Opt level: O0

int AnalyzeFrameSBG(uchar *buf,int buflen,int *pmid,int *pmclass,int *pframelen,
                   int *pnbBytesToRequest,int *pnbBytesToDiscard)

{
  uint16 uVar1;
  int iVar2;
  int *pnbBytesToRequest_local;
  int *pframelen_local;
  int *pmclass_local;
  int *pmid_local;
  int buflen_local;
  uchar *buf_local;
  
  *pframelen = 0;
  *pnbBytesToRequest = -1;
  *pnbBytesToDiscard = 0;
  if (buflen < 9) {
    *pnbBytesToRequest = 9 - buflen;
    buf_local._4_4_ = 6;
  }
  else if ((*buf == 0xff) && (buf[1] == 'Z')) {
    *pmid = (uint)buf[2];
    *pmclass = (uint)buf[3];
    iVar2 = GetFrameLengthSBG(buf);
    *pframelen = iVar2;
    if (buflen < *pframelen) {
      *pnbBytesToRequest = *pframelen - buflen;
      buf_local._4_4_ = 6;
    }
    else {
      uVar1 = CalcCRCSBG(buf + 2,(short)*pframelen - 5);
      if ((uint)uVar1 == (uint)buf[*pframelen + -2] * 0x100 + (uint)buf[*pframelen + -3]) {
        buf_local._4_4_ = 0;
      }
      else {
        printf("Warning : SBG CRC error. \n");
        *pnbBytesToDiscard = 2;
        buf_local._4_4_ = 1;
      }
    }
  }
  else {
    *pnbBytesToDiscard = 1;
    buf_local._4_4_ = 1;
  }
  return buf_local._4_4_;
}

Assistant:

inline int AnalyzeFrameSBG(unsigned char* buf, int buflen, int* pmid, int* pmclass, int* pframelen, 
							int* pnbBytesToRequest, int* pnbBytesToDiscard)
{
	*pframelen = 0;
	*pnbBytesToRequest = -1;
	*pnbBytesToDiscard = 0;
	if (buflen < MIN_FRAME_LEN_SBG)
	{
		*pnbBytesToRequest = MIN_FRAME_LEN_SBG-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	if ((buf[0] != SYNC1_SBG)||(buf[1] != SYNC2_SBG))
	{
		*pnbBytesToDiscard = 1; // We are only sure that the first sync byte can be discarded...
		return EXIT_FAILURE;
	}
	*pmid = buf[2];
	*pmclass = buf[3];
	*pframelen = GetFrameLengthSBG(buf);	
	if (buflen < *pframelen)
	{
		*pnbBytesToRequest = *pframelen-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	if (CalcCRCSBG(buf+2, (uint16)(*pframelen-5)) != ((buf[*pframelen-2]<<8)+buf[*pframelen-3]))
	{ 
		printf("Warning : SBG CRC error. \n");
		*pnbBytesToDiscard = 2; // We are only sure that the 2 sync bytes can be discarded...
		return EXIT_FAILURE;	
	}

	return EXIT_SUCCESS;
}